

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O3

void ssh2_ppk_derive_keys
               (uint fmt_version,ppk_cipher *ciphertype,ptrlen passphrase,strbuf *storage,
               ptrlen *cipherkey,ptrlen *cipheriv,ptrlen *mackey,ptrlen passphrase_salt,
               ppk_save_parameters *params)

{
  bool bVar1;
  ssh_hash *psVar2;
  uchar *puVar3;
  ulong uVar4;
  size_t len;
  ulong new_len;
  uint32_t taglen;
  unsigned_long val;
  ptrlen pVar5;
  uint32_t passes;
  BinarySource src [1];
  anon_union_4_2_2262d70e_for_ppk_save_parameters_4 local_5c;
  BinarySource local_58;
  
  if (fmt_version - 1 < 2) {
    val = 0;
    if (ciphertype->keylen == 0) {
      new_len = 0;
    }
    else {
      uVar4 = 0x14;
      do {
        psVar2 = sha1_select(&ssh_sha1);
        if (psVar2 != (ssh_hash *)0x0) {
          (*psVar2->vt->reset)(psVar2);
        }
        BinarySink_put_uint32(psVar2->binarysink_,val);
        BinarySink_put_datapl(psVar2->binarysink_,passphrase);
        puVar3 = (uchar *)strbuf_append(storage,0x14);
        (*psVar2->vt->digest)(psVar2,puVar3);
        (*psVar2->vt->free)(psVar2);
        val = (unsigned_long)((int)val + 1);
        new_len = ciphertype->keylen;
        bVar1 = uVar4 < new_len;
        uVar4 = (ulong)((int)uVar4 + 0x14);
      } while (bVar1);
    }
    strbuf_shrink_to(storage,new_len);
    BinarySink_put_padding(storage->binarysink_,ciphertype->ivlen,'\0');
    psVar2 = sha1_select(&ssh_sha1);
    if (psVar2 != (ssh_hash *)0x0) {
      (*psVar2->vt->reset)(psVar2);
    }
    len = psVar2->vt->hlen;
    pVar5.len = 0x1e;
    pVar5.ptr = "putty-private-key-file-mac-key";
    BinarySink_put_datapl(psVar2->binarysink_,pVar5);
    BinarySink_put_datapl(psVar2->binarysink_,passphrase);
    puVar3 = (uchar *)strbuf_append(storage,len);
    (*psVar2->vt->digest)(psVar2,puVar3);
    (*psVar2->vt->free)(psVar2);
  }
  else {
    if (fmt_version != 3) {
      __assert_fail("false && \"bad format version in ssh2_ppk_derive_keys\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/sshpubk.c",
                    0x2a7,
                    "void ssh2_ppk_derive_keys(unsigned int, const struct ppk_cipher *, ptrlen, strbuf *, ptrlen *, ptrlen *, ptrlen *, ptrlen, ppk_save_parameters *)"
                   );
    }
    if (ciphertype->keylen == 0) {
      len = 0;
    }
    else {
      local_58.data = "";
      local_58.pos = 0;
      taglen = (int)ciphertype->ivlen + (int)ciphertype->keylen + 0x20;
      if (params->argon2_passes_auto == true) {
        argon2_choose_passes
                  (params->argon2_flavour,params->argon2_mem,(params->field_4).argon2_passes,
                   &local_5c.argon2_passes,params->argon2_parallelism,taglen,passphrase,
                   passphrase_salt,(ptrlen)ZEXT816(0x13eb23),(ptrlen)ZEXT816(0x13eb23),storage);
        params->argon2_passes_auto = false;
        params->field_4 = local_5c;
      }
      else {
        argon2(params->argon2_flavour,params->argon2_mem,(params->field_4).argon2_passes,
               params->argon2_parallelism,taglen,passphrase,passphrase_salt,
               (ptrlen)ZEXT816(0x13eb23),(ptrlen)ZEXT816(0x13eb23),storage);
      }
      len = 0x20;
    }
  }
  local_58.data = storage->u;
  local_58.len = storage->len;
  local_58.binarysource_ = &local_58;
  local_58.pos = 0;
  local_58.err = BSE_NO_ERROR;
  pVar5 = BinarySource_get_data(local_58.binarysource_,ciphertype->keylen);
  *cipherkey = pVar5;
  pVar5 = BinarySource_get_data(local_58.binarysource_,ciphertype->ivlen);
  *cipheriv = pVar5;
  pVar5 = BinarySource_get_data(local_58.binarysource_,len);
  *mackey = pVar5;
  return;
}

Assistant:

static void ssh2_ppk_derive_keys(
    unsigned fmt_version, const struct ppk_cipher *ciphertype,
    ptrlen passphrase, strbuf *storage, ptrlen *cipherkey, ptrlen *cipheriv,
    ptrlen *mackey, ptrlen passphrase_salt, ppk_save_parameters *params)
{
    size_t mac_keylen;

    switch (fmt_version) {
      case 3: {
        if (ciphertype->keylen == 0) {
            mac_keylen = 0;
            break;
        }
        ptrlen empty = PTRLEN_LITERAL("");

        mac_keylen = 32;

        uint32_t taglen = ciphertype->keylen + ciphertype->ivlen + mac_keylen;

        if (params->argon2_passes_auto) {
            uint32_t passes;

            argon2_choose_passes(
                params->argon2_flavour, params->argon2_mem,
                params->argon2_milliseconds, &passes,
                params->argon2_parallelism, taglen,
                passphrase, passphrase_salt, empty, empty, storage);

            params->argon2_passes_auto = false;
            params->argon2_passes = passes;
        } else {
            argon2(params->argon2_flavour, params->argon2_mem,
                   params->argon2_passes, params->argon2_parallelism, taglen,
                   passphrase, passphrase_salt, empty, empty, storage);
        }

        break;
      }

      case 2:
      case 1: {
        /* Counter-mode iteration to generate cipher key data. */
        for (unsigned ctr = 0; ctr * 20 < ciphertype->keylen; ctr++) {
            ssh_hash *h = ssh_hash_new(&ssh_sha1);
            put_uint32(h, ctr);
            put_datapl(h, passphrase);
            ssh_hash_final(h, strbuf_append(storage, 20));
        }
        strbuf_shrink_to(storage, ciphertype->keylen);

        /* In this version of the format, the CBC IV was always all 0. */
        put_padding(storage, ciphertype->ivlen, 0);

        /* Completely separate hash for the MAC key. */
        ssh_hash *h = ssh_hash_new(&ssh_sha1);
        mac_keylen = ssh_hash_alg(h)->hlen;
        put_datapl(h, PTRLEN_LITERAL("putty-private-key-file-mac-key"));
        put_datapl(h, passphrase);
        ssh_hash_final(h, strbuf_append(storage, mac_keylen));

        break;
      }

      default:
        unreachable("bad format version in ssh2_ppk_derive_keys");
    }

    BinarySource src[1];
    BinarySource_BARE_INIT_PL(src, ptrlen_from_strbuf(storage));
    *cipherkey = get_data(src, ciphertype->keylen);
    *cipheriv = get_data(src, ciphertype->ivlen);
    *mackey = get_data(src, mac_keylen);
}